

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zt_cstr.c
# Opt level: O2

size_t zt_cstr_copy(char *from,ssize_t i,ssize_t j,char *to,size_t len)

{
  size_t sVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  ulong __n;
  
  sVar1 = strlen(from);
  if (sVar1 == 0) {
    lVar3 = 0;
    lVar2 = 0;
  }
  else {
    lVar4 = (i >> 0x3f & sVar1) + i;
    if ((long)sVar1 <= lVar4) {
      lVar4 = sVar1 - 1;
    }
    lVar2 = (j >> 0x3f & sVar1) + j;
    if ((long)sVar1 <= lVar2) {
      lVar2 = sVar1 - 1;
    }
    lVar3 = lVar2;
    if (lVar2 < lVar4) {
      lVar3 = lVar4;
    }
    if (lVar4 < lVar2) {
      lVar2 = lVar4;
    }
  }
  lVar3 = lVar2 - lVar3;
  lVar4 = -lVar3;
  if (0 < lVar3) {
    lVar4 = lVar3;
  }
  __n = lVar4 + 1U;
  if (len <= lVar4 + 1U) {
    __n = len;
  }
  memcpy(to,from + lVar2,__n);
  return __n;
}

Assistant:

size_t
zt_cstr_copy(const char * from, ssize_t i, ssize_t j, char * to, size_t len) {
    size_t    flen;
    ssize_t    min;

    CONVERT(from, i, j);
    flen = IDXLEN(i, j);

    min  = MIN(flen, len);
    memcpy(to, &from[i], min);
    return min;
}